

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::InitializeRead
          (ColumnReader *this,idx_t row_group_idx_p,
          vector<duckdb_parquet::ColumnChunk,_true> *columns,TProtocol *protocol_p)

{
  const_reference pvVar1;
  runtime_error *this_00;
  TProtocol *in_RCX;
  vector<duckdb_parquet::ColumnChunk,_true> *in_RDX;
  ColumnReader *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  
  ColumnIndex(in_RDI);
  pvVar1 = vector<duckdb_parquet::ColumnChunk,_true>::operator[](in_RDX,in_stack_ffffffffffffffb8);
  in_RDI->chunk = pvVar1;
  in_RDI->protocol = in_RCX;
  if (((byte)in_RDI->chunk->__isset & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Only inlined data files are supported (no references)");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  in_RDI->chunk_read_offset = (in_RDI->chunk->meta_data).data_page_offset;
  if ((((byte)(in_RDI->chunk->meta_data).__isset >> 2 & 1) != 0) &&
     (3 < (in_RDI->chunk->meta_data).dictionary_page_offset)) {
    in_RDI->chunk_read_offset = (in_RDI->chunk->meta_data).dictionary_page_offset;
  }
  in_RDI->group_rows_available = (in_RDI->chunk->meta_data).num_values;
  return;
}

Assistant:

void ColumnReader::InitializeRead(idx_t row_group_idx_p, const vector<ColumnChunk> &columns, TProtocol &protocol_p) {
	D_ASSERT(ColumnIndex() < columns.size());
	chunk = &columns[ColumnIndex()];
	protocol = &protocol_p;
	D_ASSERT(chunk);
	D_ASSERT(chunk->__isset.meta_data);

	if (chunk->__isset.file_path) {
		throw std::runtime_error("Only inlined data files are supported (no references)");
	}

	// ugh. sometimes there is an extra offset for the dict. sometimes it's wrong.
	chunk_read_offset = chunk->meta_data.data_page_offset;
	if (chunk->meta_data.__isset.dictionary_page_offset && chunk->meta_data.dictionary_page_offset >= 4) {
		// this assumes the data pages follow the dict pages directly.
		chunk_read_offset = chunk->meta_data.dictionary_page_offset;
	}
	group_rows_available = chunk->meta_data.num_values;
}